

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::root_path(path *__return_storage_ptr__,path *this)

{
  format fmt;
  path pStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [32];
  
  root_name((path *)local_38,this);
  std::__cxx11::string::string((string *)&local_78,local_38);
  root_directory(&pStack_b8,this);
  std::__cxx11::string::string((string *)&local_98,(string *)&pStack_b8);
  std::operator+(&local_58,&local_78,&local_98);
  path(__return_storage_ptr__,(string_type *)&local_58,fmt);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&pStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_path() const
{
    return path(root_name().string() + root_directory().string(), native_format);
}